

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>::
reserve(vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
        *this,size_t n)

{
  ulong uVar1;
  TriangleMesh **ppTVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    ppTVar2 = pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>::
              allocate_object<pbrt::TriangleMesh_const*>
                        ((polymorphic_allocator<pbrt::TriangleMesh_const*> *)this,n);
    uVar1 = this->nStored;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      ppTVar2[uVar3] = this->ptr[uVar3];
    }
    pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>::
    deallocate_object<pbrt::TriangleMesh_const*>
              ((polymorphic_allocator<pbrt::TriangleMesh_const*> *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = ppTVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }